

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalGhsMultiGenerator::SetGeneratorPlatform
          (cmGlobalGhsMultiGenerator *this,string *p,cmMakefile *mf)

{
  bool bVar1;
  string_view value;
  string_view value_00;
  string tgt;
  string arch;
  cmValue platform;
  cmValue t;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_48;
  cmValue local_28;
  cmValue local_20;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GHS_PRIMARY_TARGET",(allocator<char> *)&local_88);
  local_20 = cmMakefile::GetDefinition(mf,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  bVar1 = cmValue::IsOff(&local_20);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"arm",(allocator<char> *)&local_88);
    value._M_str = (p->_M_dataplus)._M_p;
    value._M_len = p->_M_string_length;
    bVar1 = cmValue::IsOff(value);
    if (!bVar1) {
      std::__cxx11::string::_M_assign((string *)&local_68);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"GHS_TARGET_PLATFORM",(allocator<char> *)&local_48);
    local_28 = cmMakefile::GetDefinition(mf,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    local_48._M_dataplus._M_p._0_1_ = 0x5f;
    cmStrCat<std::__cxx11::string&,char,cmValue&,char_const(&)[5]>
              (&local_88,&local_68,(char *)&local_48,&local_28,(char (*) [5])".tgt");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"GHS_PRIMARY_TARGET",&local_89);
    value_00._M_str = local_88._M_dataplus._M_p;
    value_00._M_len = local_88._M_string_length;
    cmMakefile::AddDefinition(mf,&local_48,value_00);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return true;
}

Assistant:

bool cmGlobalGhsMultiGenerator::SetGeneratorPlatform(std::string const& p,
                                                     cmMakefile* mf)
{
  /* set primary target */
  cmValue t = mf->GetDefinition("GHS_PRIMARY_TARGET");
  if (t.IsOff()) {
    /* Use the value from `-A` or use `arm` */
    std::string arch = "arm";
    if (!cmIsOff(p)) {
      arch = p;
    }
    cmValue platform = mf->GetDefinition("GHS_TARGET_PLATFORM");
    std::string tgt = cmStrCat(arch, '_', platform, ".tgt");

    /* update the primary target name*/
    mf->AddDefinition("GHS_PRIMARY_TARGET", tgt);
  }
  return true;
}